

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  uint16_t *puVar1;
  pointer *pppVVar2;
  EnumDef **ppEVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  int iVar6;
  size_type sVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  SymbolTable<flatbuffers::Value> *pSVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  unsigned_long langs;
  StructDef *pSVar16;
  long lVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  EnumVal *pEVar20;
  Value *pVVar21;
  long *plVar22;
  EnumDef *pEVar23;
  size_type *psVar25;
  long *plVar26;
  string *in_RDX;
  undefined8 *puVar27;
  int t;
  int *piVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  string type_name;
  FieldDef *typefield;
  FieldDef *field;
  string name;
  voffset_t id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Value *local_188;
  EnumDef *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  SymbolTable<flatbuffers::Value> *local_158;
  _Alloc_hider local_150;
  StructDef *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  EnumDef *local_130;
  long local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  char *local_118;
  Value *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Alloc_hider local_e8;
  StructDef *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  EnumDef *pEVar24;
  
  sVar7 = (struct_def->super_Definition).file._M_string_length;
  local_e8._M_p = (pointer)&local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,sVar7,
             (struct_def->super_Definition).file.field_2._M_allocated_capacity + sVar7);
  pSVar16 = LookupCreateStruct((Parser *)struct_def,(string *)&local_e8,false,false);
  if (pSVar16 != (StructDef *)0x0) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"field name can not be the same as table/struct name","");
    Error(this,(string *)struct_def);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                               CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                        local_178.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    goto LAB_00108198;
  }
  if (local_e0 != (StructDef *)0x0) {
    bVar29 = false;
    pSVar16 = (StructDef *)0x1;
    do {
      cVar5 = (local_e8._M_p + -1)[(long)pSVar16];
      if ((0x19 < (int)cVar5 - 0x61U) && (cVar5 != '_' && 9 < (int)cVar5 - 0x30U)) break;
      bVar29 = local_e0 <= pSVar16;
      bVar30 = pSVar16 != local_e0;
      pSVar16 = (StructDef *)((long)&(pSVar16->super_Definition).name._M_dataplus._M_p + 1);
    } while (bVar30);
    if (!bVar29) {
      std::operator+(&local_178,"field names should be lowercase snake_case, got: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8)
      ;
      Warning((Parser *)struct_def,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_178._M_dataplus._M_p._4_4_,(uint)local_178._M_dataplus._M_p) !=
          &local_178.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_178._M_dataplus._M_p._4_4_,(uint)local_178._M_dataplus._M_p),
                        CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                                 CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                          local_178.field_2._M_allocated_capacity._0_2_)) + 1);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(struct_def->super_Definition).doc_comment.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  t = (int)struct_def;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      local_178.field_2._M_allocated_capacity._0_2_ = 0;
      local_178.field_2._M_allocated_capacity._2_4_ = 0;
      local_178.field_2._M_allocated_capacity._6_2_ = BASE_TYPE_NONE >> 0x10;
      local_178.field_2._8_2_ = 0;
      local_178._M_dataplus._M_p._0_4_ = 0;
      local_178._M_dataplus._M_p._4_4_ = 0;
      local_178._M_string_length._0_2_ = 0;
      local_178._M_string_length._2_2_ = 0;
      local_178._M_string_length._4_4_ = 0;
      ParseType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        uVar14 = (uint)local_178._M_dataplus._M_p;
        if (in_RDX[8].field_2._M_local_buf[0] == '\x01') {
          if ((uint)local_178._M_dataplus._M_p == 0x11) {
            if (local_178._M_dataplus._M_p._4_4_ == 0xf) {
              plVar22 = (long *)CONCAT44(local_178._M_string_length._4_4_,
                                         CONCAT22(local_178._M_string_length._2_2_,
                                                  (undefined2)local_178._M_string_length));
              if (*(char *)((long)plVar22 + 0x111) == '\x01') goto LAB_00107c99;
              goto LAB_00107d98;
            }
            if (0xb < local_178._M_dataplus._M_p._4_4_ - 1) goto LAB_00107e8d;
LAB_00107dcb:
            if ((uint)local_178._M_dataplus._M_p != 0x11) goto LAB_00107e1f;
            pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(byte *)pppVVar2 = *(byte *)pppVVar2 | 1;
            if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                (undefined1  [16])0xffffffffffffb854) == (undefined1  [16])0x0) {
              uVar14 = 0x11;
              goto LAB_00107eca;
            }
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,
                       "Arrays are not yet supported in all the specified programming languages.",""
                      );
            Error(this,(string *)struct_def);
          }
          else {
            if ((uint)local_178._M_dataplus._M_p == 0xf) {
              plVar22 = (long *)CONCAT44(local_178._M_string_length._4_4_,
                                         CONCAT22(local_178._M_string_length._2_2_,
                                                  (undefined2)local_178._M_string_length));
              if (*(char *)((long)plVar22 + 0x111) != '\0') {
LAB_00107c99:
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a8,*plVar22,plVar22[1] + *plVar22);
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_108,
                           "Incomplete type in struct is not allowed, type name: ","");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_150,&local_108,&local_1a8);
                Error(this,(string *)struct_def);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_p != &local_140) {
                  operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00107f25;
              }
LAB_00107d98:
              if ((char)plVar22[0x22] != '\0') goto LAB_00107dcb;
            }
            else if ((uint)local_178._M_dataplus._M_p - 1 < 0xc) goto LAB_00107eca;
LAB_00107e8d:
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,"structs may contain only scalar or struct fields","");
            Error(this,(string *)struct_def);
          }
LAB_00107f25:
          local_68.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
          local_68._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_0010818b;
        }
        else {
          if ((uint)local_178._M_dataplus._M_p == 0x11) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,"fixed-length array in table must be wrapped in struct",
                       "");
            Error(this,(string *)struct_def);
            goto LAB_00107f25;
          }
LAB_00107e1f:
          local_130 = (EnumDef *)0x0;
          if ((uint)local_178._M_dataplus._M_p == 0x10) {
            lVar17 = CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                              CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                       local_178.field_2._M_allocated_capacity._0_2_));
            local_1a8._M_string_length = *(size_type *)(lVar17 + 0xd8);
            local_1a8.field_2._M_allocated_capacity = *(size_type *)(lVar17 + 0xe0);
            local_1a8.field_2._8_8_ = *(ulong *)(lVar17 + 0xe8);
            local_1a8._M_dataplus._M_p._4_4_ =
                 (undefined4)((ulong)*(undefined8 *)(lVar17 + 0xd0) >> 0x20);
            local_1a8._M_dataplus._M_p._0_4_ = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_150,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e8,"_type");
            AddField(this,struct_def,in_RDX,(Type *)&local_150,(FieldDef **)&local_1a8);
LAB_00107fa0:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_p != &local_140) {
              operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
            }
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010818b;
          }
          else {
LAB_00107eca:
            local_130 = (EnumDef *)0x0;
            if (((uVar14 - 0xe & 0xfffffffb) == 0) && (local_178._M_dataplus._M_p._4_4_ == 0x10)) {
              pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                          super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(byte *)pppVVar2 = *(byte *)pppVVar2 | 2;
              if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                  (undefined1  [16])0xfffffffffff47c34) != (undefined1  [16])0x0) {
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a8,
                           "Vectors of unions are not yet supported in at least one of the specified programming languages."
                           ,"");
                Error(this,(string *)struct_def);
                goto LAB_00107f25;
              }
              local_1a8.field_2._M_allocated_capacity =
                   CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                            CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                     local_178.field_2._M_allocated_capacity._0_2_));
              local_1a8._M_dataplus._M_p = (pointer)0x10000000e;
              local_1a8._M_string_length = 0;
              local_1a8.field_2._8_8_ = local_1a8.field_2._8_8_ & 0xffffffffffff0000;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_150,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e8,"_type");
              AddField(this,struct_def,in_RDX,(Type *)&local_150,(FieldDef **)&local_1a8);
              goto LAB_00107fa0;
            }
          }
          AddField(this,struct_def,in_RDX,(Type *)&local_e8,(FieldDef **)&local_178);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010818b;
          if (local_130 != (EnumDef *)0x0) {
            ((_Base_ptr)((long)&local_130->vals + 0x30))->_M_left = (_Base_ptr)local_110;
            local_110[4].type.enum_def = local_130;
          }
          pVVar21 = local_110;
          if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x3d)
          goto LAB_001080e6;
          Next(this);
          pVVar21 = local_110;
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010818b;
          ParseSingleValue(this,(string *)struct_def,local_110,(bool)((char)local_110 + -0x38));
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010818b;
          if ((((uint)local_178._M_dataplus._M_p == 0xf) &&
              (*(char *)(CONCAT44(local_178._M_string_length._4_4_,
                                  CONCAT22(local_178._M_string_length._2_2_,
                                           (undefined2)local_178._M_string_length)) + 0x110) != '\0'
              )) || ((in_RDX[8].field_2._M_local_buf[0] == '\x01' &&
                     (iVar15 = std::__cxx11::string::compare((char *)&pVVar21[3].type.enum_def),
                     iVar15 != 0)))) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,
                       "default values are not supported for struct fields, table fields, or in structs."
                       ,"");
            Error(this,(string *)struct_def);
            goto LAB_00107f25;
          }
          if (((uint)local_178._M_dataplus._M_p < 0x13) &&
             ((0x46000U >> ((uint)local_178._M_dataplus._M_p & 0x1f) & 1) != 0)) {
            pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(byte *)pppVVar2 = *(byte *)pppVVar2 | 8;
            iVar15 = std::__cxx11::string::compare((char *)&pVVar21[3].type.enum_def);
            if ((iVar15 != 0) &&
               (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                (undefined1  [16])0xfffffffffffcbfff) != (undefined1  [16])0x0)) {
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,
                         "Default values for strings and vectors are not supported in one of the specified programming languages"
                         ,"");
              Error(this,(string *)struct_def);
              goto LAB_00107f25;
            }
          }
          if (((uint)local_178._M_dataplus._M_p == 0x12) ||
             ((uint)local_178._M_dataplus._M_p == 0xe)) {
            ppEVar3 = &pVVar21[3].type.enum_def;
            iVar15 = std::__cxx11::string::compare((char *)ppEVar3);
            if ((iVar15 != 0) &&
               (iVar15 = std::__cxx11::string::compare((char *)ppEVar3), iVar15 != 0)) {
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,"The only supported default for vectors is `[]`.","");
              Error(this,(string *)struct_def);
              goto LAB_00107f25;
            }
          }
LAB_001080e6:
          if ((uint)local_178._M_dataplus._M_p - 0xb < 2) {
            if (*(long *)&pVVar21[3].type.fixed_length == 0) {
              __assert_fail("false == text.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                            ,0x3f1,"CheckedError flatbuffers::Parser::ParseField(StructDef &)");
            }
            ppEVar3 = &pVVar21[3].type.enum_def;
            pEVar23 = *ppEVar3;
            do {
              pEVar24 = (EnumDef *)((long)&(pEVar23->super_Definition).name._M_dataplus._M_p + 1);
              bVar32 = *(byte *)&(pEVar23->super_Definition).name._M_dataplus._M_p;
              pEVar23 = pEVar24;
            } while (bVar32 == 0x20);
            if ((bVar32 == 0x2b) || (bVar32 == 0x2d)) {
              bVar32 = *(byte *)&(pEVar24->super_Definition).name._M_dataplus._M_p;
            }
            if (((bVar32 != 0x5f) && (0x19 < (int)(char)(bVar32 & 0xdf) - 0x41U)) &&
               (lVar17 = std::__cxx11::string::find_first_of((char *)ppEVar3,0x14fc01,0),
               lVar17 == -1)) {
              std::__cxx11::string::append((char *)ppEVar3);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pVVar21->offset,&local_48);
          ppEVar3 = &pVVar21[1].type.enum_def;
          ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)struct_def);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010818b;
          paVar4 = &local_1a8.field_2;
          local_1a8._M_dataplus._M_p = (pointer)paVar4;
          local_188 = pVVar21;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"deprecated","");
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)ppEVar3,&local_1a8);
          local_180 = (EnumDef *)&local_188[1].type.fixed_length;
          if ((EnumDef *)cVar18._M_node == local_180) {
            bVar29 = false;
          }
          else {
            bVar29 = *(long *)(cVar18._M_node + 2) != 0;
          }
          local_188[3].constant.field_2._M_local_buf[8] = bVar29;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar4) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          local_1a8._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"hash","");
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)ppEVar3,&local_1a8);
          if ((EnumDef *)cVar18._M_node == local_180) {
            local_128 = 0;
          }
          else {
            local_128 = *(long *)(cVar18._M_node + 2);
          }
          local_158 = (SymbolTable<flatbuffers::Value> *)ppEVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar4) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if (local_128 == 0) {
LAB_001084a1:
            paVar4 = &local_1a8.field_2;
            local_1a8._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"vector64","");
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                             *)local_158,&local_1a8);
            if ((EnumDef *)cVar18._M_node == local_180) {
              bVar29 = true;
            }
            else {
              bVar29 = *(long *)(cVar18._M_node + 2) == 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != paVar4) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar12 = local_158;
            if (!bVar29) {
              if (((uint)local_178._M_dataplus._M_p != 0xe) &&
                 ((uint)local_178._M_dataplus._M_p != 0x12)) {
                local_1a8._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a8,
                           "`vector64` attribute can only be applied on vectors.","");
                Error(this,(string *)struct_def);
                goto LAB_00107f25;
              }
              local_178._M_dataplus._M_p._0_4_ = 0x12;
              local_178.field_2._8_2_ = 0;
              *(ulong *)&local_188[2].field_0x42 =
                   CONCAT26(local_178.field_2._M_allocated_capacity._0_2_,
                            CONCAT42(local_178._M_string_length._4_4_,
                                     local_178._M_string_length._2_2_));
              *(undefined4 *)((long)&local_188[3].type.base_type + 2) =
                   local_178.field_2._M_allocated_capacity._2_4_;
              *(undefined2 *)((long)&local_188[3].type.element + 2) =
                   local_178.field_2._M_allocated_capacity._6_2_;
              *(undefined2 *)&local_188[3].type.struct_def = 0;
              *(undefined4 *)((long)&local_188[2].constant.field_2 + 8) = 0x12;
              *(ulong *)((long)&local_188[2].constant.field_2 + 0xc) =
                   CONCAT26(local_178._M_string_length._2_2_,
                            CONCAT24((undefined2)local_178._M_string_length,
                                     local_178._M_dataplus._M_p._4_4_));
              *(undefined4 *)&local_188[2].field_0x44 = local_178._M_string_length._4_4_;
              local_188[3].constant.field_2._M_local_buf[0xd] = '\x01';
            }
            local_1a8._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"offset64","");
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                             *)pSVar12,&local_1a8);
            if ((EnumDef *)cVar18._M_node == local_180) {
              bVar29 = true;
            }
            else {
              bVar29 = *(long *)(cVar18._M_node + 2) == 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != paVar4) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar12 = local_158;
            if (bVar29) {
              if ((local_188[3].constant.field_2._M_local_buf[0xd] & 1U) != 0) goto LAB_0010863a;
LAB_00108763:
              local_1a8._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"key","");
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)pSVar12,&local_1a8);
              if ((EnumDef *)cVar18._M_node == local_180) {
                bVar29 = false;
              }
              else {
                bVar29 = *(long *)(cVar18._M_node + 2) != 0;
              }
              local_188[3].constant.field_2._M_local_buf[9] = bVar29;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar4) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              local_1a8._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"required","");
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)pSVar12,&local_1a8);
              if (((EnumDef *)cVar18._M_node == local_180) ||
                 (bVar32 = 1, *(long *)(cVar18._M_node + 2) == 0)) {
                if ((uint)local_178._M_dataplus._M_p == 0xd) {
                  bVar32 = local_188[3].constant.field_2._M_local_buf[9];
                }
                else {
                  bVar32 = 0;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar4) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              bVar29 = false;
              if (((uint)local_178._M_dataplus._M_p < 0x13) &&
                 (bVar29 = false, (0x46000U >> ((uint)local_178._M_dataplus._M_p & 0x1f) & 1) != 0))
              {
                iVar15 = std::__cxx11::string::compare((char *)&local_188[3].type.enum_def);
                bVar29 = iVar15 != 0;
              }
              if ((uint)local_178._M_dataplus._M_p - 1 < 0xc) {
                iVar15 = std::__cxx11::string::compare((char *)&local_188[3].type.enum_def);
                bVar31 = iVar15 == 0;
              }
              else {
                bVar31 = (bVar29 | bVar32) ^ 1;
              }
              bVar29 = (bVar32 & bVar31) == 1;
              if (bVar29) {
                local_1a8._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a8,"Fields cannot be both optional and required.","");
                Error(this,(string *)struct_def);
              }
              else {
                if (bVar29) {
                  __assert_fail("!(required && optional)",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                                ,0x178,
                                "static Presence flatbuffers::FieldDef::MakeFieldPresence(bool, bool)"
                               );
                }
                iVar15 = 0;
                if (bVar32 == 0) {
                  iVar15 = 2 - (uint)bVar31;
                }
                *(int *)&local_188[3].offset = iVar15;
                if ((bVar32 == 0) ||
                   ((in_RDX[8].field_2._M_local_buf[0] == '\0' &&
                    (0xb < (uint)local_178._M_dataplus._M_p - 1)))) {
                  if (local_188[3].constant.field_2._M_local_buf[9] == '\x01') {
                    if (in_RDX[8].field_2._M_local_buf[3] == '\x01') {
                      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1a8,"only one field may be set as \'key\'","");
                      Error(this,(string *)struct_def);
                    }
                    else {
                      in_RDX[8].field_2._M_local_buf[3] = '\x01';
                      if ((uint)local_178._M_dataplus._M_p - 1 < 0xd) goto LAB_00108ac7;
                      if ((uint)local_178._M_dataplus._M_p == 0xf) {
LAB_00108b5e:
                        if (*(char *)(CONCAT44(local_178._M_string_length._4_4_,
                                               CONCAT22(local_178._M_string_length._2_2_,
                                                        (undefined2)local_178._M_string_length)) +
                                     0x110) != '\0') goto LAB_00108ac7;
                      }
                      else if ((uint)local_178._M_dataplus._M_p == 0x11) {
                        if (local_178._M_dataplus._M_p._4_4_ - 1 < 0xc) goto LAB_00108ac7;
                        if (local_178._M_dataplus._M_p._4_4_ == 0xf) goto LAB_00108b5e;
                      }
                      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1a8,
                                 "\'key\' field must be string, scalar type or fixed size array of scalars"
                                 ,"");
                      Error(this,(string *)struct_def);
                    }
                  }
                  else {
LAB_00108ac7:
                    if ((*(int *)((long)&local_188[2].constant.field_2 + 8) - 1U < 0xc) &&
                       (*(int *)&local_188[3].offset == 1)) {
                      pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                                  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      *(byte *)pppVVar2 = *(byte *)pppVVar2 | 4;
                      lVar17 = CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                                        CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                                 local_178.field_2._M_allocated_capacity._0_2_));
                      if (lVar17 != 0) {
                        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1a8,"null","");
                        cVar19 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                                         *)(lVar17 + 0xf0),&local_1a8);
                        if (cVar19._M_node == (_Base_ptr)(lVar17 + 0xf8)) {
                          bVar29 = true;
                        }
                        else {
                          bVar29 = *(long *)(cVar19._M_node + 2) == 0;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                          operator_delete(local_1a8._M_dataplus._M_p,
                                          local_1a8.field_2._M_allocated_capacity + 1);
                        }
                        if (!bVar29) {
                          if (9 < (uint)local_178._M_dataplus._M_p - 1) {
                            __assert_fail("IsInteger(type.base_type)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                          ,0x480,
                                          "CheckedError flatbuffers::Parser::ParseField(StructDef &)"
                                         );
                          }
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_150,
                                         "the default \'null\' is reserved for declaring optional scalar fields, it conflicts with declaration of enum \'"
                                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                                                      CONCAT42(local_178.field_2.
                                                               _M_allocated_capacity._2_4_,
                                                               local_178.field_2.
                                                               _M_allocated_capacity._0_2_)));
                          plVar22 = (long *)std::__cxx11::string::append((char *)&local_150);
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          psVar25 = (size_type *)(plVar22 + 2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*plVar22 ==
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)psVar25) {
                            local_1a8.field_2._M_allocated_capacity = *psVar25;
                            local_1a8.field_2._8_8_ = plVar22[3];
                          }
                          else {
                            local_1a8.field_2._M_allocated_capacity = *psVar25;
                            local_1a8._M_dataplus._M_p = (pointer)*plVar22;
                          }
                          local_1a8._M_string_length = plVar22[1];
                          *plVar22 = (long)psVar25;
                          plVar22[1] = 0;
                          *(undefined1 *)(plVar22 + 2) = 0;
                          Error(this,(string *)struct_def);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                            operator_delete(local_1a8._M_dataplus._M_p,
                                            local_1a8.field_2._M_allocated_capacity + 1);
                          }
                          local_68.field_2._M_allocated_capacity = local_140._M_allocated_capacity;
                          local_68._M_dataplus._M_p = local_150._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_150._M_p == &local_140) goto LAB_0010818b;
                          goto LAB_00107f37;
                        }
                      }
                      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"key","")
                      ;
                      cVar18 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                       *)local_158,&local_1a8);
                      if ((EnumDef *)cVar18._M_node == local_180) {
                        bVar29 = true;
                      }
                      else {
                        bVar29 = *(long *)(cVar18._M_node + 2) == 0;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                        operator_delete(local_1a8._M_dataplus._M_p,
                                        local_1a8.field_2._M_allocated_capacity + 1);
                      }
                      if (bVar29) {
                        uVar8 = *(ulong *)((long)&struct_def[5].super_Definition.name.field_2 + 8);
                        if ((uVar8 == 0) || (uVar8 < 0x80001 && (uVar8 & 0xfffffffffff41c50) == 0))
                        goto LAB_00108cb1;
                        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1a8,
                                   "Optional scalars are not yet supported in at least one of the specified programming languages."
                                   ,"");
                        Error(this,(string *)struct_def);
                      }
                      else {
                        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1a8,
                                   "only a non-optional scalar field can be used as a \'key\' field"
                                   ,"");
                        Error(this,(string *)struct_def);
                      }
                    }
                    else {
LAB_00108cb1:
                      lVar17 = CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                                        CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                                 local_178.field_2._M_allocated_capacity._0_2_));
                      if (lVar17 == 0) {
LAB_00108f6f:
                        if ((local_188[3].constant.field_2._M_local_buf[8] == '\x01') &&
                           (in_RDX[8].field_2._M_local_buf[0] == '\x01')) {
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"can\'t deprecate fields in a struct","");
                          Error(this,(string *)struct_def);
                        }
                        else {
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"cpp_type","");
                          cVar18 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                           *)local_158,&local_1a8);
                          if ((EnumDef *)cVar18._M_node == local_180) {
                            puVar27 = (undefined8 *)0x0;
                          }
                          else {
                            puVar27 = *(undefined8 **)(cVar18._M_node + 2);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                            operator_delete(local_1a8._M_dataplus._M_p,
                                            local_1a8.field_2._M_allocated_capacity + 1);
                          }
                          if (puVar27 != (undefined8 *)0x0) {
                            if (local_128 == 0) {
                              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,
                                         "cpp_type can only be used with a hashed field","");
                              Error(this,(string *)struct_def);
                              goto LAB_00109600;
                            }
                            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1a8,"cpp_ptr_type","");
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                             *)local_158,&local_1a8);
                            if ((EnumDef *)cVar18._M_node == local_180) {
                              bVar29 = true;
                            }
                            else {
                              bVar29 = *(long *)(cVar18._M_node + 2) == 0;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                              operator_delete(local_1a8._M_dataplus._M_p,
                                              local_1a8.field_2._M_allocated_capacity + 1);
                            }
                            if (bVar29) {
                              pVVar21 = (Value *)operator_new(0x48);
                              *(undefined8 *)((long)&(pVVar21->type).struct_def + 2) = 0;
                              *(undefined8 *)((long)&(pVVar21->type).enum_def + 2) = 0;
                              (pVVar21->type).base_type = BASE_TYPE_NONE;
                              (pVVar21->type).element = BASE_TYPE_NONE;
                              (pVVar21->type).struct_def = (StructDef *)0x0;
                              (pVVar21->constant)._M_dataplus._M_p =
                                   (pointer)&(pVVar21->constant).field_2;
                              *(undefined2 *)&(pVVar21->constant).field_2 = 0x30;
                              (pVVar21->constant)._M_string_length = 1;
                              pVVar21->offset = 0xffff;
                              uVar9 = *puVar27;
                              pSVar16 = (StructDef *)puVar27[1];
                              uVar10 = *(undefined8 *)((long)puVar27 + 10);
                              uVar11 = *(undefined8 *)((long)puVar27 + 0x12);
                              (pVVar21->type).base_type = (int)uVar9;
                              (pVVar21->type).element = (int)((ulong)uVar9 >> 0x20);
                              (pVVar21->type).struct_def = pSVar16;
                              *(undefined8 *)((long)&(pVVar21->type).struct_def + 2) = uVar10;
                              *(undefined8 *)((long)&(pVVar21->type).enum_def + 2) = uVar11;
                              std::__cxx11::string::operator=((string *)&pVVar21->constant,"naked");
                              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,"cpp_ptr_type","");
                              SymbolTable<flatbuffers::Value>::Add(local_158,&local_1a8,pVVar21);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                operator_delete(local_1a8._M_dataplus._M_p,
                                                local_1a8.field_2._M_allocated_capacity + 1);
                              }
                            }
                          }
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"shared","");
                          cVar18 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                           *)local_158,&local_1a8);
                          if ((EnumDef *)cVar18._M_node == local_180) {
                            bVar32 = false;
                          }
                          else {
                            bVar32 = *(long *)(cVar18._M_node + 2) != 0;
                          }
                          local_188[3].constant.field_2._M_local_buf[10] = bVar32;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                            operator_delete(local_1a8._M_dataplus._M_p,
                                            local_1a8.field_2._M_allocated_capacity + 1);
                            bVar32 = local_188[3].constant.field_2._M_local_buf[10];
                          }
                          if (((bVar32 & 1) == 0) ||
                             (*(int *)((long)&local_188[2].constant.field_2 + 8) == 0xd)) {
                            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1a8,"native_custom_alloc","");
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                             *)local_158,&local_1a8);
                            if ((EnumDef *)cVar18._M_node == local_180) {
                              bVar29 = true;
                            }
                            else {
                              bVar29 = *(long *)(cVar18._M_node + 2) == 0;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                              operator_delete(local_1a8._M_dataplus._M_p,
                                              local_1a8.field_2._M_allocated_capacity + 1);
                            }
                            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                            if (bVar29) {
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,"native_inline","");
                              cVar18 = std::
                                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                               *)local_158,&local_1a8);
                              if ((EnumDef *)cVar18._M_node == local_180) {
                                bVar32 = false;
                              }
                              else {
                                bVar32 = *(long *)(cVar18._M_node + 2) != 0;
                              }
                              local_188[3].constant.field_2._M_local_buf[0xb] = bVar32;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                operator_delete(local_1a8._M_dataplus._M_p,
                                                local_1a8.field_2._M_allocated_capacity + 1);
                                bVar32 = local_188[3].constant.field_2._M_local_buf[0xb];
                              }
                              if ((bVar32 & 1) != 0) {
                                iVar15 = *(int *)((long)&local_188[2].constant.field_2 + 8);
                                if ((iVar15 == 0xe) || (iVar15 == 0x12)) {
                                  iVar6 = *(int *)((long)&local_188[2].constant.field_2 + 0xc);
                                  if (((iVar6 != 0xf) ||
                                      (*(char *)(*(long *)&local_188[2].offset + 0x110) == '\0')) &&
                                     ((((iVar15 != 0x12 && (iVar15 != 0xe)) || (iVar6 != 0xf)) ||
                                      (*(char *)(*(long *)&local_188[2].offset + 0x110) == '\x01')))
                                     ) goto LAB_00109390;
                                }
                                else if ((iVar15 != 0xf) ||
                                        (*(char *)(*(long *)&local_188[2].offset + 0x110) == '\0'))
                                {
LAB_00109390:
                                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1a8,
                                             "\'native_inline\' can only be defined on structs, vector of structs or vector of tables"
                                             ,"");
                                  Error(this,(string *)struct_def);
                                  goto LAB_00109600;
                                }
                              }
                              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,"nested_flatbuffer","");
                              cVar18 = std::
                                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                               *)local_158,&local_1a8);
                              if ((EnumDef *)cVar18._M_node == local_180) {
                                piVar28 = (int *)0x0;
                              }
                              else {
                                piVar28 = *(int **)(cVar18._M_node + 2);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                operator_delete(local_1a8._M_dataplus._M_p,
                                                local_1a8.field_2._M_allocated_capacity + 1);
                              }
                              if (piVar28 == (int *)0x0) {
LAB_0010946e:
                                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1a8,"flexbuffer","");
                                ppEVar3 = &local_188[1].type.enum_def;
                                cVar18 = std::
                                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                                 *)ppEVar3,&local_1a8);
                                puVar1 = &local_188[1].type.fixed_length;
                                if (cVar18._M_node == (_Base_ptr)puVar1) {
                                  bVar29 = true;
                                }
                                else {
                                  bVar29 = *(long *)(cVar18._M_node + 2) == 0;
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                  operator_delete(local_1a8._M_dataplus._M_p,
                                                  local_1a8.field_2._M_allocated_capacity + 1);
                                }
                                if (!bVar29) {
                                  local_188[3].constant.field_2._M_local_buf[0xc] = '\x01';
                                  *(undefined1 *)
                                   &struct_def[5].super_Definition.attributes.vec.
                                    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish = 1;
                                  if (((uint)local_178._M_dataplus._M_p != 0xe) ||
                                     (local_178._M_dataplus._M_p._4_4_ != 4)) {
                                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1a8,
                                               "flexbuffer attribute may only apply to a vector of ubyte"
                                               ,"");
                                    Error(this,(string *)struct_def);
                                    goto LAB_00109600;
                                  }
                                }
                                local_180 = local_130;
                                if (local_130 != (EnumDef *)0x0) {
                                  if (0xb < *(int *)&local_130->is_union - 1U) {
                                    *(undefined4 *)
                                     &((_Base_ptr)((long)&local_130->vals + 0x10))->_M_right =
                                         *(undefined4 *)&local_188[3].offset;
                                  }
                                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1a8,"id","");
                                  cVar18 = std::
                                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                           ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                                  *)ppEVar3,&local_1a8);
                                  if (cVar18._M_node == (_Base_ptr)puVar1) {
                                    puVar27 = (undefined8 *)0x0;
                                  }
                                  else {
                                    puVar27 = *(undefined8 **)(cVar18._M_node + 2);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                    operator_delete(local_1a8._M_dataplus._M_p,
                                                    local_1a8.field_2._M_allocated_capacity + 1);
                                  }
                                  if (puVar27 != (undefined8 *)0x0) {
                                    local_88._M_dataplus._M_p._0_2_ = 0;
                                    anon_unknown_0::atot<unsigned_short>
                                              ((anon_unknown_0 *)&local_1a8,(char *)puVar27[4],
                                               (Parser *)struct_def,(unsigned_short *)&local_88);
                                    uVar13 = (ushort)local_88._M_dataplus._M_p;
                                    if ((ushort)local_88._M_dataplus._M_p == 0 ||
                                        (char)local_1a8._M_dataplus._M_p != '\0') {
                                      std::operator+(&local_108,
                                                                                                          
                                                  "a union type effectively adds two fields with non-negative ids, its id must be that of the second field (the first field is the type field and not explicitly declared in the schema);\nfield: "
                                                  ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_188);
                                      plVar22 = (long *)std::__cxx11::string::append
                                                                  ((char *)&local_108);
                                      psVar25 = (size_type *)(plVar22 + 2);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)*plVar22 ==
                                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)psVar25) {
                                        local_140._M_allocated_capacity = *psVar25;
                                        local_140._8_8_ = plVar22[3];
                                        local_150._M_p = (pointer)&local_140;
                                      }
                                      else {
                                        local_140._M_allocated_capacity = *psVar25;
                                        local_150._M_p = (pointer)*plVar22;
                                      }
                                      local_148 = (StructDef *)plVar22[1];
                                      *plVar22 = (long)psVar25;
                                      plVar22[1] = 0;
                                      *(undefined1 *)(plVar22 + 2) = 0;
                                      std::operator+(&local_1a8,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_150,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(puVar27 + 4));
                                      Error(this,(string *)struct_def);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                        operator_delete(local_1a8._M_dataplus._M_p,
                                                        local_1a8.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_150._M_p != &local_140) {
                                        operator_delete(local_150._M_p,
                                                        local_140._M_allocated_capacity + 1);
                                      }
                                      local_68.field_2._M_allocated_capacity =
                                           local_108.field_2._M_allocated_capacity;
                                      local_68._M_dataplus._M_p = local_108._M_dataplus._M_p;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_108._M_dataplus._M_p == &local_108.field_2)
                                      goto LAB_0010818b;
                                      goto LAB_00107f37;
                                    }
                                    pVVar21 = (Value *)operator_new(0x48);
                                    *(undefined8 *)((long)&(pVVar21->type).struct_def + 2) = 0;
                                    *(undefined8 *)((long)&(pVVar21->type).enum_def + 2) = 0;
                                    (pVVar21->type).base_type = BASE_TYPE_NONE;
                                    (pVVar21->type).element = BASE_TYPE_NONE;
                                    (pVVar21->type).struct_def = (StructDef *)0x0;
                                    (pVVar21->constant)._M_dataplus._M_p =
                                         (pointer)&(pVVar21->constant).field_2;
                                    *(undefined2 *)&(pVVar21->constant).field_2 = 0x30;
                                    (pVVar21->constant)._M_string_length = 1;
                                    pVVar21->offset = 0xffff;
                                    uVar9 = *puVar27;
                                    pSVar16 = (StructDef *)puVar27[1];
                                    uVar10 = *(undefined8 *)((long)puVar27 + 10);
                                    uVar11 = *(undefined8 *)((long)puVar27 + 0x12);
                                    (pVVar21->type).base_type = (int)uVar9;
                                    (pVVar21->type).element = (int)((ulong)uVar9 >> 0x20);
                                    (pVVar21->type).struct_def = pSVar16;
                                    *(undefined8 *)((long)&(pVVar21->type).struct_def + 2) = uVar10;
                                    *(undefined8 *)((long)&(pVVar21->type).enum_def + 2) = uVar11;
                                    NumToString<int>(&local_1a8,uVar13 - 1);
                                    std::__cxx11::string::operator=
                                              ((string *)&pVVar21->constant,(string *)&local_1a8);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1a8,"id","");
                                    SymbolTable<flatbuffers::Value>::Add
                                              ((SymbolTable<flatbuffers::Value> *)
                                               &((_Base_ptr)
                                                ((long)&local_180->super_Definition + 0x40))->
                                                _M_right,&local_1a8,pVVar21);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                      operator_delete(local_1a8._M_dataplus._M_p,
                                                      local_1a8.field_2._M_allocated_capacity + 1);
                                    }
                                  }
                                  if (local_110[3].constant.field_2._M_local_buf[8] == '\x01') {
                                    *(undefined1 *)
                                     &((_Base_ptr)((long)&local_130->vals + 0x10))->_M_left = 1;
                                  }
                                }
                                Expect(this,t);
                                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) =
                                     1;
                                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                                  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                                }
                                goto LAB_0010818b;
                              }
                              if (*piVar28 == 0xd) {
                                if ((((uint)local_178._M_dataplus._M_p - 0xe & 0xfffffffb) == 0) &&
                                   (local_178._M_dataplus._M_p._4_4_ == 4)) {
                                  pSVar16 = LookupCreateStruct((Parser *)struct_def,
                                                               (string *)(piVar28 + 8),true,false);
                                  local_188 = local_110;
                                  *(StructDef **)&local_110[4].type = pSVar16;
                                  goto LAB_0010946e;
                                }
                                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1a8,
                                           "nested_flatbuffer attribute may only apply to a vector of ubyte"
                                           ,"");
                                Error(this,(string *)struct_def);
                              }
                              else {
                                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1a8,
                                           "nested_flatbuffer attribute must be a string (the root type)"
                                           ,"");
                                Error(this,(string *)struct_def);
                              }
                            }
                            else {
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,
                                         "native_custom_alloc can only be used with a table or struct definition"
                                         ,"");
                              Error(this,(string *)struct_def);
                            }
                          }
                          else {
                            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1a8,"shared can only be defined on strings",
                                       "");
                            Error(this,(string *)struct_def);
                          }
                        }
                      }
                      else {
                        ppEVar3 = &local_188[3].type.enum_def;
                        switch((uint)local_178._M_dataplus._M_p) {
                        case 0xe:
                        case 0x12:
                          iVar15 = std::__cxx11::string::compare((char *)ppEVar3);
                          if ((iVar15 == 0) ||
                             (iVar15 = std::__cxx11::string::compare((char *)ppEVar3), iVar15 == 0))
                          goto LAB_00108f6f;
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"Vector defaults may only be `[]`.","");
                          Error(this,(string *)struct_def);
                          break;
                        default:
                          if ((uint)local_178._M_dataplus._M_p - 1 < 10) {
                            if (*(int *)&local_188[3].offset != 1) {
                              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,"bit_flags","");
                              cVar18 = std::
                                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                               *)(lVar17 + 0x58),&local_1a8);
                              if (cVar18._M_node == (_Base_ptr)(lVar17 + 0x60)) {
                                bVar29 = true;
                              }
                              else {
                                bVar29 = *(long *)(cVar18._M_node + 2) == 0;
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                operator_delete(local_1a8._M_dataplus._M_p,
                                                local_1a8.field_2._M_allocated_capacity + 1);
                              }
                              if ((bVar29) &&
                                 (pEVar20 = EnumDef::FindByValue
                                                      ((EnumDef *)
                                                       CONCAT26(local_178.field_2.
                                                                _M_allocated_capacity._6_2_,
                                                                CONCAT42(local_178.field_2.
                                                                         _M_allocated_capacity._2_4_
                                                                         ,local_178.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)),(string *)ppEVar3)
                                 , pEVar20 == (EnumVal *)0x0)) {
                                std::operator+(&local_68,"default value of `",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)ppEVar3);
                                plVar22 = (long *)std::__cxx11::string::append((char *)&local_68);
                                plVar26 = plVar22 + 2;
                                if ((long *)*plVar22 == plVar26) {
                                  local_b8 = *plVar26;
                                  lStack_b0 = plVar22[3];
                                  local_c8 = &local_b8;
                                }
                                else {
                                  local_b8 = *plVar26;
                                  local_c8 = (long *)*plVar22;
                                }
                                local_c0 = plVar22[1];
                                *plVar22 = (long)plVar26;
                                plVar22[1] = 0;
                                *(undefined1 *)(plVar22 + 2) = 0;
                                plVar22 = (long *)std::__cxx11::string::append((char *)&local_c8);
                                psVar25 = (size_type *)(plVar22 + 2);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)*plVar22 ==
                                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)psVar25) {
                                  local_a8.field_2._M_allocated_capacity = *psVar25;
                                  local_a8.field_2._8_8_ = plVar22[3];
                                  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                                }
                                else {
                                  local_a8.field_2._M_allocated_capacity = *psVar25;
                                  local_a8._M_dataplus._M_p = (pointer)*plVar22;
                                }
                                local_a8._M_string_length = plVar22[1];
                                *plVar22 = (long)psVar25;
                                plVar22[1] = 0;
                                *(undefined1 *)(plVar22 + 2) = 0;
                                std::operator+(&local_88,&local_a8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_e8);
                                plVar22 = (long *)std::__cxx11::string::append((char *)&local_88);
                                psVar25 = (size_type *)(plVar22 + 2);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)*plVar22 ==
                                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)psVar25) {
                                  local_108.field_2._M_allocated_capacity = *psVar25;
                                  local_108.field_2._8_8_ = plVar22[3];
                                  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                                }
                                else {
                                  local_108.field_2._M_allocated_capacity = *psVar25;
                                  local_108._M_dataplus._M_p = (pointer)*plVar22;
                                }
                                local_108._M_string_length = plVar22[1];
                                *plVar22 = (long)psVar25;
                                plVar22[1] = 0;
                                *(undefined1 *)(plVar22 + 2) = 0;
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_150,&local_108,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT26(local_178.field_2._M_allocated_capacity.
                                                           _6_2_,CONCAT42(local_178.field_2.
                                                                          _M_allocated_capacity.
                                                                          _2_4_,local_178.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)));
                                plVar22 = (long *)std::__cxx11::string::append((char *)&local_150);
                                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                psVar25 = (size_type *)(plVar22 + 2);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)*plVar22 ==
                                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)psVar25) {
                                  local_1a8.field_2._M_allocated_capacity = *psVar25;
                                  local_1a8.field_2._8_8_ = plVar22[3];
                                }
                                else {
                                  local_1a8.field_2._M_allocated_capacity = *psVar25;
                                  local_1a8._M_dataplus._M_p = (pointer)*plVar22;
                                }
                                local_1a8._M_string_length = plVar22[1];
                                *plVar22 = (long)psVar25;
                                plVar22[1] = 0;
                                *(undefined1 *)(plVar22 + 2) = 0;
                                Error(this,(string *)struct_def);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                  operator_delete(local_1a8._M_dataplus._M_p,
                                                  local_1a8.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_150._M_p != &local_140) {
                                  operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1
                                                 );
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                                  operator_delete(local_108._M_dataplus._M_p,
                                                  local_108.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT62(local_88._M_dataplus._M_p._2_6_,
                                                (ushort)local_88._M_dataplus._M_p) !=
                                    &local_88.field_2) {
                                  operator_delete((undefined1 *)
                                                  CONCAT62(local_88._M_dataplus._M_p._2_6_,
                                                           (ushort)local_88._M_dataplus._M_p),
                                                  local_88.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                                  operator_delete(local_a8._M_dataplus._M_p,
                                                  local_a8.field_2._M_allocated_capacity + 1);
                                }
                                if (local_c8 != &local_b8) {
                                  operator_delete(local_c8,local_b8 + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_68._M_dataplus._M_p == &local_68.field_2)
                                goto LAB_0010818b;
                                goto LAB_00107f37;
                              }
                            }
                            goto LAB_00108f6f;
                          }
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"Enums must have integer base types","");
                          Error(this,(string *)struct_def);
                          break;
                        case 0x10:
                          iVar15 = std::__cxx11::string::compare((char *)ppEVar3);
                          if (iVar15 == 0) goto LAB_00108f6f;
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"Union defaults must be NONE","");
                          Error(this,(string *)struct_def);
                          break;
                        case 0x11:
                          iVar15 = std::__cxx11::string::compare((char *)ppEVar3);
                          if (iVar15 == 0) goto LAB_00108f6f;
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"Array defaults are not supported yet.",""
                                    );
                          Error(this,(string *)struct_def);
                        }
                      }
                    }
                  }
                }
                else {
                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a8,
                             "only non-scalar fields in tables may be \'required\'","");
                  Error(this,(string *)struct_def);
                }
              }
            }
            else {
              if ((uint)local_178._M_dataplus._M_p == 0x12) {
                local_1a8._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a8,
                           "attribute `vector64` implies `offset64` and isn\'t required.","");
                Warning((Parser *)struct_def,&local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != paVar4) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
              }
              local_188[3].constant.field_2._M_local_buf[0xd] = '\x01';
LAB_0010863a:
              if ((uint)local_178._M_dataplus._M_p == 0xd) goto LAB_0010872a;
              if (((uint)local_178._M_dataplus._M_p == 0xe) ||
                 ((uint)local_178._M_dataplus._M_p == 0x12)) {
                if (local_178._M_dataplus._M_p._4_4_ - 1 < 0xc) {
                  if ((local_178._M_dataplus._M_p._4_4_ - 1 < 10) &&
                     (CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                               CONCAT42(local_178.field_2._M_allocated_capacity._2_4_,
                                        local_178.field_2._M_allocated_capacity._0_2_)) != 0)) {
LAB_0010879f:
                    local_1a8._M_dataplus._M_p = (pointer)paVar4;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1a8,
                               "only vectors of scalars are allowed to be 64-bit.","");
                    Error(this,(string *)struct_def);
                    goto LAB_00107f25;
                  }
                }
                else if ((local_178._M_dataplus._M_p._4_4_ != 0xf) ||
                        (*(char *)(CONCAT44(local_178._M_string_length._4_4_,
                                            CONCAT22(local_178._M_string_length._2_2_,
                                                     (undefined2)local_178._M_string_length)) +
                                  0x110) == '\0')) goto LAB_0010879f;
LAB_0010872a:
                if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                    (undefined1  [16])0xfffffffffffffe77) != (undefined1  [16])0x0) {
                  local_1a8._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1a8,
                             "fields using 64-bit offsets are not yet supported in at least one of the specified programming languages."
                             ,"");
                  Error(this,(string *)struct_def);
                  goto LAB_00107f25;
                }
                goto LAB_00108763;
              }
              local_1a8._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,
                         "only string and vectors can have `offset64` attribute applied","");
              Error(this,(string *)struct_def);
            }
LAB_00109600:
            local_68.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_0010818b;
          }
          else {
            uVar14 = (uint)local_178._M_dataplus._M_p;
            if (((uint)local_178._M_dataplus._M_p - 0xe & 0xfffffffb) == 0) {
              uVar14 = local_178._M_dataplus._M_p._4_4_;
            }
            if (10 < uVar14) {
LAB_001086e7:
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,
                         "only short, ushort, int, uint, long and ulong data types support hashing."
                         ,"");
              Error(this,(string *)struct_def);
              goto LAB_00107f25;
            }
            if ((0x60U >> (uVar14 & 0x1f) & 1) == 0) {
              if ((0x180U >> (uVar14 & 0x1f) & 1) == 0) {
                if ((0x600U >> (uVar14 & 0x1f) & 1) == 0) goto LAB_001086e7;
                local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_128 + 0x20);
                local_118 = *(char **)(local_128 + 0x20);
                lVar17 = 0;
                bVar29 = true;
                do {
                  bVar30 = bVar29;
                  iVar15 = strcmp(local_118,(&kHashFunctions64)[lVar17 * 2]);
                  if (iVar15 == 0) {
                    if ((&PTR_HashFnv1<unsigned_long>_0016ab38)[lVar17 * 2] != (undefined *)0x0)
                    goto LAB_001084a1;
                    break;
                  }
                  lVar17 = 1;
                  bVar29 = false;
                } while (bVar30);
                std::operator+(&local_1a8,"Unknown hashing algorithm for 64 bit types: ",local_120);
                Error(this,(string *)struct_def);
              }
              else {
                local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_128 + 0x20);
                local_118 = *(char **)(local_128 + 0x20);
                lVar17 = 0;
                bVar29 = true;
                do {
                  bVar30 = bVar29;
                  iVar15 = strcmp(local_118,(&kHashFunctions32)[lVar17 * 2]);
                  if (iVar15 == 0) {
                    if ((&PTR_HashFnv1<unsigned_int>_0016ab18)[lVar17 * 2] != (undefined *)0x0)
                    goto LAB_001084a1;
                    break;
                  }
                  lVar17 = 1;
                  bVar29 = false;
                } while (bVar30);
                std::operator+(&local_1a8,"Unknown hashing algorithm for 32 bit types: ",local_120);
                Error(this,(string *)struct_def);
              }
            }
            else {
              local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_128 + 0x20);
              local_118 = *(char **)(local_128 + 0x20);
              lVar17 = 0;
              bVar29 = true;
              do {
                bVar30 = bVar29;
                iVar15 = strcmp(local_118,(&kHashFunctions16)[lVar17 * 2]);
                if (iVar15 == 0) {
                  if ((&PTR_HashFnv1<unsigned_short>_0016aaf8)[lVar17 * 2] != (undefined *)0x0)
                  goto LAB_001084a1;
                  break;
                }
                lVar17 = 1;
                bVar29 = false;
              } while (bVar30);
              std::operator+(&local_1a8,"Unknown hashing algorithm for 16 bit types: ",local_120);
              Error(this,(string *)struct_def);
            }
            local_68.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_0010818b;
          }
        }
LAB_00107f37:
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0010818b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
LAB_00108198:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;

  if (LookupCreateStruct(name, false, false))
    return Error("field name can not be the same as table/struct name");

  if (!IsLowerSnakeCase(name)) {
    Warning("field names should be lowercase snake_case, got: " + name);
  }

  std::vector<std::string> dc = doc_comment_;
  EXPECT(kTokenIdentifier);
  EXPECT(':');
  Type type;
  ECHECK(ParseType(type));

  if (struct_def.fixed) {
    if (IsIncompleteStruct(type) ||
        (IsArray(type) && IsIncompleteStruct(type.VectorType()))) {
      std::string type_name = IsArray(type) ? type.VectorType().struct_def->name
                                            : type.struct_def->name;
      return Error(
          std::string("Incomplete type in struct is not allowed, type name: ") +
          type_name);
    }

    auto valid = IsScalar(type.base_type) || IsStruct(type);
    if (!valid && IsArray(type)) {
      const auto &elem_type = type.VectorType();
      valid |= IsScalar(elem_type.base_type) || IsStruct(elem_type);
    }
    if (!valid)
      return Error("structs may contain only scalar or struct fields");
  }

  if (!struct_def.fixed && IsArray(type))
    return Error("fixed-length array in table must be wrapped in struct");

  if (IsArray(type)) {
    advanced_features_ |= reflection::AdvancedArrayFeatures;
    if (!SupportsAdvancedArrayFeatures()) {
      return Error(
          "Arrays are not yet supported in all "
          "the specified programming languages.");
    }
  }

  FieldDef *typefield = nullptr;
  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with a special suffix.

    // To ensure compatibility with many codes that rely on the BASE_TYPE_UTYPE value to identify union type fields.
    Type union_type(type.enum_def->underlying_type);
    union_type.base_type = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(),union_type, &typefield));
    
  } else if (IsVector(type) && type.element == BASE_TYPE_UNION) {
    advanced_features_ |= reflection::AdvancedUnionFeatures;
    // Only cpp, js and ts supports the union vector feature so far.
    if (!SupportsAdvancedUnionFeatures()) {
      return Error(
          "Vectors of unions are not yet supported in at least one of "
          "the specified programming languages.");
    }
    // For vector of union fields, add a second auto-generated vector field to
    // hold the types, with a special suffix.
    Type union_vector(BASE_TYPE_VECTOR, nullptr, type.enum_def);
    union_vector.element = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(), union_vector,
                    &typefield));
  }

  FieldDef *field;
  ECHECK(AddField(struct_def, name, type, &field));

  if (typefield) {
    // We preserve the relation between the typefield
    // and field, so we can easily map it in the code
    // generators.
    typefield->sibling_union_field = field;
    field->sibling_union_field = typefield;
  }

  if (token_ == '=') {
    NEXT();
    ECHECK(ParseSingleValue(&field->name, field->value, true));
    if (IsStruct(type) || (struct_def.fixed && field->value.constant != "0"))
      return Error(
          "default values are not supported for struct fields, table fields, "
          "or in structs.");
    if (IsString(type) || IsVector(type)) {
      advanced_features_ |= reflection::DefaultVectorsAndStrings;
      if (field->value.constant != "0" && !SupportsDefaultVectorsAndStrings()) {
        return Error(
            "Default values for strings and vectors are not supported in one "
            "of the specified programming languages");
      }
    }

    if (IsVector(type) && field->value.constant != "0" &&
        field->value.constant != "[]") {
      return Error("The only supported default for vectors is `[]`.");
    }
  }

  // Append .0 if the value has not it (skip hex and scientific floats).
  // This suffix needed for generated C++ code.
  if (IsFloat(type.base_type)) {
    auto &text = field->value.constant;
    FLATBUFFERS_ASSERT(false == text.empty());
    auto s = text.c_str();
    while (*s == ' ') s++;
    if (*s == '-' || *s == '+') s++;
    // 1) A float constants (nan, inf, pi, etc) is a kind of identifier.
    // 2) A float number needn't ".0" at the end if it has exponent.
    if ((false == IsIdentifierStart(*s)) &&
        (std::string::npos == field->value.constant.find_first_of(".eEpP"))) {
      field->value.constant += ".0";
    }
  }

  field->doc_comment = dc;
  ECHECK(ParseMetaData(&field->attributes));
  field->deprecated = field->attributes.Lookup("deprecated") != nullptr;
  auto hash_name = field->attributes.Lookup("hash");
  if (hash_name) {
    switch ((IsVector(type)) ? type.element : type.base_type) {
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: {
        if (FindHashFunction16(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 16 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: {
        if (FindHashFunction32(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 32 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        if (FindHashFunction64(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 64 bit types: " +
                       hash_name->constant);
        break;
      }
      default:
        return Error(
            "only short, ushort, int, uint, long and ulong data types support "
            "hashing.");
    }
  }

  if (field->attributes.Lookup("vector64") != nullptr) {
    if (!IsVector(type)) {
      return Error("`vector64` attribute can only be applied on vectors.");
    }

    // Upgrade the type to be a BASE_TYPE_VECTOR64, since the attributes are
    // parsed after the type.
    const BaseType element_base_type = type.element;
    type = Type(BASE_TYPE_VECTOR64, type.struct_def, type.enum_def);
    type.element = element_base_type;

    // Since the field was already added to the parent object, update the type
    // in place.
    field->value.type = type;

    // 64-bit vectors imply the offset64 attribute.
    field->offset64 = true;
  }

  // Record that this field uses 64-bit offsets.
  if (field->attributes.Lookup("offset64") != nullptr) {
    // TODO(derekbailey): would be nice to have this be a recommendation or hint
    // instead of a warning.
    if (type.base_type == BASE_TYPE_VECTOR64) {
      Warning("attribute `vector64` implies `offset64` and isn't required.");
    }

    field->offset64 = true;
  }

  // Check for common conditions with Offset64 fields.
  if (field->offset64) {
    // TODO(derekbailey): this is where we can disable string support for
    // offset64, as that is not a hard requirement to have.
    if (!IsString(type) && !IsVector(type)) {
      return Error(
          "only string and vectors can have `offset64` attribute applied");
    }

    // If this is a Vector, only scalar and scalar-like (structs) items are
    // allowed.
    // TODO(derekbailey): allow vector of strings, just require that the strings
    // are Offset64<string>.
    if (IsVector(type) &&
        !((IsScalar(type.element) && !IsEnum(type.VectorType())) ||
          IsStruct(type.VectorType()))) {
      return Error("only vectors of scalars are allowed to be 64-bit.");
    }

    // Lastly, check if it is supported by the specified generated languages. Do
    // this last so the above checks can inform the user of schema errors to fix
    // first.
    if (!Supports64BitOffsets()) {
      return Error(
          "fields using 64-bit offsets are not yet supported in at least one "
          "of the specified programming languages.");
    }
  }

  // For historical convenience reasons, string keys are assumed required.
  // Scalars are kDefault unless otherwise specified.
  // Nonscalars are kOptional unless required;
  field->key = field->attributes.Lookup("key") != nullptr;
  const bool required = field->attributes.Lookup("required") != nullptr ||
                        (IsString(type) && field->key);
  const bool default_str_or_vec =
      ((IsString(type) || IsVector(type)) && field->value.constant != "0");
  const bool optional = IsScalar(type.base_type)
                            ? (field->value.constant == "null")
                            : !(required || default_str_or_vec);
  if (required && optional) {
    return Error("Fields cannot be both optional and required.");
  }
  field->presence = FieldDef::MakeFieldPresence(optional, required);

  if (required && (struct_def.fixed || IsScalar(type.base_type))) {
    return Error("only non-scalar fields in tables may be 'required'");
  }
  if (field->key) {
    if (struct_def.has_key) return Error("only one field may be set as 'key'");
    struct_def.has_key = true;
    auto is_valid =
        IsScalar(type.base_type) || IsString(type) || IsStruct(type);
    if (IsArray(type)) {
      is_valid |=
          IsScalar(type.VectorType().base_type) || IsStruct(type.VectorType());
    }
    if (!is_valid) {
      return Error(
          "'key' field must be string, scalar type or fixed size array of "
          "scalars");
    }
  }

  if (field->IsScalarOptional()) {
    advanced_features_ |= reflection::OptionalScalars;
    if (type.enum_def && type.enum_def->Lookup("null")) {
      FLATBUFFERS_ASSERT(IsInteger(type.base_type));
      return Error(
          "the default 'null' is reserved for declaring optional scalar "
          "fields, it conflicts with declaration of enum '" +
          type.enum_def->name + "'.");
    }
    if (field->attributes.Lookup("key")) {
      return Error(
          "only a non-optional scalar field can be used as a 'key' field");
    }
    if (!SupportsOptionalScalars()) {
      return Error(
          "Optional scalars are not yet supported in at least one of "
          "the specified programming languages.");
    }
  }

  if (type.enum_def) {
    // Verify the enum's type and default value.
    const std::string &constant = field->value.constant;
    if (type.base_type == BASE_TYPE_UNION) {
      if (constant != "0") { return Error("Union defaults must be NONE"); }
    } else if (IsVector(type)) {
      if (constant != "0" && constant != "[]") {
        return Error("Vector defaults may only be `[]`.");
      }
    } else if (IsArray(type)) {
      if (constant != "0") {
        return Error("Array defaults are not supported yet.");
      }
    } else {
      if (!IsInteger(type.base_type)) {
        return Error("Enums must have integer base types");
      }
      // Optional and bitflags enums may have default constants that are not
      // their specified variants.
      if (!field->IsOptional() &&
          type.enum_def->attributes.Lookup("bit_flags") == nullptr) {
        if (type.enum_def->FindByValue(constant) == nullptr) {
          return Error("default value of `" + constant + "` for " + "field `" +
                       name + "` is not part of enum `" + type.enum_def->name +
                       "`.");
        }
      }
    }
  }

  if (field->deprecated && struct_def.fixed)
    return Error("can't deprecate fields in a struct");

  auto cpp_type = field->attributes.Lookup("cpp_type");
  if (cpp_type) {
    if (!hash_name)
      return Error("cpp_type can only be used with a hashed field");
    /// forcing cpp_ptr_type to 'naked' if unset
    auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
    if (!cpp_ptr_type) {
      auto val = new Value();
      val->type = cpp_type->type;
      val->constant = "naked";
      field->attributes.Add("cpp_ptr_type", val);
    }
  }

  field->shared = field->attributes.Lookup("shared") != nullptr;
  if (field->shared && field->value.type.base_type != BASE_TYPE_STRING)
    return Error("shared can only be defined on strings");

  auto field_native_custom_alloc =
      field->attributes.Lookup("native_custom_alloc");
  if (field_native_custom_alloc)
    return Error(
        "native_custom_alloc can only be used with a table or struct "
        "definition");

  field->native_inline = field->attributes.Lookup("native_inline") != nullptr;
  if (field->native_inline && !IsStruct(field->value.type) &&
      !IsVectorOfStruct(field->value.type) &&
      !IsVectorOfTable(field->value.type))
    return Error(
        "'native_inline' can only be defined on structs, vector of structs or "
        "vector of tables");

  auto nested = field->attributes.Lookup("nested_flatbuffer");
  if (nested) {
    if (nested->type.base_type != BASE_TYPE_STRING)
      return Error(
          "nested_flatbuffer attribute must be a string (the root type)");
    if (!IsVector(type.base_type) || type.element != BASE_TYPE_UCHAR)
      return Error(
          "nested_flatbuffer attribute may only apply to a vector of ubyte");
    // This will cause an error if the root type of the nested flatbuffer
    // wasn't defined elsewhere.
    field->nested_flatbuffer = LookupCreateStruct(nested->constant);
  }

  if (field->attributes.Lookup("flexbuffer")) {
    field->flexbuffer = true;
    uses_flexbuffers_ = true;
    if (type.base_type != BASE_TYPE_VECTOR || type.element != BASE_TYPE_UCHAR)
      return Error("flexbuffer attribute may only apply to a vector of ubyte");
  }

  if (typefield) {
    if (!IsScalar(typefield->value.type.base_type)) {
      // this is a union vector field
      typefield->presence = field->presence;
    }
    // If this field is a union, and it has a manually assigned id,
    // the automatically added type field should have an id as well (of N - 1).
    auto attr = field->attributes.Lookup("id");
    if (attr) {
      const auto &id_str = attr->constant;
      voffset_t id = 0;
      const auto done = !atot(id_str.c_str(), *this, &id).Check();
      if (done && id > 0) {
        auto val = new Value();
        val->type = attr->type;
        val->constant = NumToString(id - 1);
        typefield->attributes.Add("id", val);
      } else {
        return Error(
            "a union type effectively adds two fields with non-negative ids, "
            "its id must be that of the second field (the first field is "
            "the type field and not explicitly declared in the schema);\n"
            "field: " +
            field->name + ", id: " + id_str);
      }
    }
    // if this field is a union that is deprecated,
    // the automatically added type field should be deprecated as well
    if (field->deprecated) { typefield->deprecated = true; }
  }

  EXPECT(';');
  return NoError();
}